

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.C
# Opt level: O1

bool __thiscall Filter::matchDir(Filter *this,string *name)

{
  int iVar1;
  _List_node_base *p_Var2;
  char cVar3;
  
  p_Var2 = (this->m_args->_inDirs).super__List_base<String,_std::allocator<String>_>._M_impl._M_node
           .super__List_node_base._M_next;
  cVar3 = p_Var2 == (_List_node_base *)&this->m_args->_inDirs;
  if (!(bool)cVar3) {
    do {
      iVar1 = fnmatch((char *)(p_Var2 + 1),(char *)name,(uint)*(byte *)&p_Var2[3]._M_next);
      if ((char)iVar1 != '\0') {
        return (bool)(char)iVar1;
      }
      p_Var2 = p_Var2->_M_next;
      cVar3 = '\0';
    } while (p_Var2 != (_List_node_base *)&this->m_args->_inDirs);
  }
  return (bool)cVar3;
}

Assistant:

bool Filter::matchDir(std::string const & name) const
{
    bool match = m_args.includeDirs().empty();

    // Include filters
    std::list<String>::const_iterator it = m_args.includeDirs().begin();
    for (; !match && it != m_args.includeDirs().end(); ++it) {
		match = fnmatch(*it, name, it->noCase());
    }

    return match;
}